

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomUniformBlockCase.cpp
# Opt level: O3

VarType * __thiscall
deqp::gls::RandomUniformBlockCase::generateType
          (VarType *__return_storage_ptr__,RandomUniformBlockCase *this,Random *rnd,int typeDepth,
          bool arrayOk)

{
  int *piVar1;
  DataType basicType;
  deRandom *rnd_00;
  VarType *pVVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined8 *puVar5;
  long *plVar6;
  long *plVar7;
  DataType flags;
  undefined8 uVar8;
  int ndx;
  undefined7 in_register_00000081;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  VarType elementType;
  DataType val;
  vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_> memberTypes;
  __normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
  local_d8;
  Data DStack_d0;
  long lStack_c0;
  ulong *local_b8;
  ulong local_b0;
  ulong local_a8 [2];
  ulong local_98;
  deUint32 local_8c;
  StructType *local_88;
  deRandom *local_80;
  string local_78;
  vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_> local_58;
  VarType *local_38;
  
  ndx = (int)CONCAT71(in_register_00000081,arrayOk);
  if ((this->m_maxStructDepth <= typeDepth) ||
     (fVar13 = deRandom_getFloat(&rnd->m_rnd), 0.1 <= fVar13)) {
    if ((arrayOk && 0 < this->m_maxArrayLength) &&
       (fVar13 = deRandom_getFloat(&rnd->m_rnd), fVar13 < 0.1)) {
      dVar3 = this->m_features;
      uVar9 = this->m_maxArrayLength;
      dVar4 = deRandom_getUint32(&rnd->m_rnd);
      generateType((VarType *)&local_d8,this,rnd,typeDepth,SUB21((ushort)(short)dVar3 >> 0xf,0));
      ub::VarType::VarType(__return_storage_ptr__,(VarType *)&local_d8,dVar4 % uVar9 + 1);
      ub::VarType::~VarType((VarType *)&local_d8);
      return __return_storage_ptr__;
    }
    local_d8._M_current = (DataType *)0x0;
    DStack_d0.array.elementType = (VarType *)0x0;
    DStack_d0._8_8_ = (VarType *)0x0;
    local_b8._0_4_ = 1;
    std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
              ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,(iterator)0x0,
               (DataType *)&local_b8);
    local_b8._0_4_ = 0x1b;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x1b;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    local_b8._0_4_ = 0x1f;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x1f;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    local_b8._0_4_ = 0x23;
    if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
      std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                 (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
    }
    else {
      (DStack_d0.array.elementType)->m_type = 0x23;
      DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
    }
    uVar9 = this->m_features;
    if ((uVar9 & 1) != 0) {
      local_b8._0_4_ = 2;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = TYPE_STRUCT;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 3;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = TYPE_LAST;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 4;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 4;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1c;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1c;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1d;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1d;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x1e;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x1e;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x20;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x20;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x21;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x21;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x22;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x22;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x24;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x24;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x25;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x25;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0x26;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0x26;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      uVar9 = this->m_features;
    }
    if ((uVar9 & 2) != 0) {
      local_b8._0_4_ = 5;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 5;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 6;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 6;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 8;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 8;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 9;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 9;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 10;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 10;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xb;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xb;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xc;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xc;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
      local_b8._0_4_ = 0xd;
      if (DStack_d0.array.elementType == (VarType *)DStack_d0._8_8_) {
        std::vector<glu::DataType,_std::allocator<glu::DataType>_>::_M_realloc_insert<glu::DataType>
                  ((vector<glu::DataType,_std::allocator<glu::DataType>_> *)&local_d8,
                   (iterator)DStack_d0.array.elementType,(DataType *)&local_b8);
      }
      else {
        (DStack_d0.array.elementType)->m_type = 0xd;
        DStack_d0.array.elementType = (VarType *)&(DStack_d0.array.elementType)->m_flags;
      }
    }
    local_b8._0_4_ = TYPE_INVALID;
    de::Random::
    choose<__gnu_cxx::__normal_iterator<glu::DataType*,std::vector<glu::DataType,std::allocator<glu::DataType>>>,glu::DataType*>
              (rnd,local_d8,
               (__normal_iterator<glu::DataType_*,_std::vector<glu::DataType,_std::allocator<glu::DataType>_>_>
                )DStack_d0.array.elementType,(DataType *)&local_b8,1);
    basicType = (DataType)local_b8;
    flags = TYPE_INVALID;
    if (3 < (DataType)local_b8 - TYPE_BOOL) {
      local_b8._0_4_ = TYPE_INVALID;
      de::Random::choose<unsigned_int_const*,unsigned_int*>
                (rnd,generateType::precisionCandidates,(uint *)"N4deqp3gls22RandomUniformBlockCaseE"
                 ,(uint *)&local_b8,1);
      flags = (DataType)local_b8;
    }
    ub::VarType::VarType(__return_storage_ptr__,basicType,flags);
    if (local_d8._M_current != (DataType *)0x0) {
      operator_delete(local_d8._M_current,DStack_d0._8_8_ - (long)local_d8._M_current);
    }
    return __return_storage_ptr__;
  }
  local_8c = this->m_features;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar9 = this->m_maxStructMembers;
  local_80 = &rnd->m_rnd;
  local_38 = __return_storage_ptr__;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  iVar12 = 0;
  local_98 = (ulong)dVar3 % (ulong)uVar9;
  uVar9 = (uint)local_98 + 1;
  if ((uint)local_98 < 0x7fffffff) {
    do {
      ndx = 1;
      generateType((VarType *)&local_d8,this,(Random *)local_80,typeDepth + 1,true);
      std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::
      emplace_back<deqp::gls::ub::VarType>(&local_58,(VarType *)&local_d8);
      ub::VarType::~VarType((VarType *)&local_d8);
      iVar12 = iVar12 + 1;
    } while (iVar12 < (int)uVar9);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"s","");
  genName_abi_cxx11_(&local_78,(gls *)0x41,'Z',(char)this->m_structNdx,ndx);
  uVar11 = 0xf;
  if (local_b8 != local_a8) {
    uVar11 = local_a8[0];
  }
  if (uVar11 < local_78._M_string_length + local_b0) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      uVar8 = local_78.field_2._M_allocated_capacity;
    }
    if (local_78._M_string_length + local_b0 <= (ulong)uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_b8);
      goto LAB_0098046c;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
LAB_0098046c:
  local_d8._M_current = (DataType *)&DStack_d0.array.size;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    DStack_d0._8_8_ = *plVar6;
    lStack_c0 = puVar5[3];
  }
  else {
    DStack_d0._8_8_ = *plVar6;
    local_d8._M_current = (DataType *)*puVar5;
  }
  DStack_d0.array.elementType = (VarType *)puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  local_88 = ub::ShaderInterface::allocStruct
                       (&(this->super_UniformBlockCase).m_interface,(char *)local_d8._M_current);
  piVar1 = &DStack_d0.array.size;
  if (local_d8._M_current != (DataType *)piVar1) {
    operator_delete(local_d8._M_current,DStack_d0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  this->m_structNdx = this->m_structNdx + 1;
  if ((uint)(float)local_98 < 0x7fffffff) {
    lVar10 = 0;
    uVar11 = 0;
    do {
      rnd_00 = local_80;
      dVar3 = 0;
      if ((local_8c >> 10 & 1) != 0) {
        fVar13 = deRandom_getFloat(local_80);
        local_98 = CONCAT44(local_98._4_4_,fVar13);
        fVar13 = deRandom_getFloat(rnd_00);
        dVar3 = (uint)(fVar13 < 0.15) << 0xb | (uint)((float)local_98 < 0.15) << 10;
      }
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"m","");
      plVar6 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b8,local_b0,0,'\x01');
      plVar7 = plVar6 + 2;
      if ((long *)*plVar6 == plVar7) {
        DStack_d0._8_8_ = *plVar7;
        lStack_c0 = plVar6[3];
        local_d8._M_current = (DataType *)piVar1;
      }
      else {
        DStack_d0._8_8_ = *plVar7;
        local_d8._M_current = (DataType *)*plVar6;
      }
      DStack_d0.array.elementType = (VarType *)plVar6[1];
      *plVar6 = (long)plVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      ub::StructType::addMember
                (local_88,(char *)local_d8._M_current,
                 (VarType *)
                 ((long)&(local_58.
                          super__Vector_base<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_type + lVar10),dVar3);
      if (local_d8._M_current != (DataType *)piVar1) {
        operator_delete(local_d8._M_current,DStack_d0._8_8_ + 1);
      }
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x18;
    } while (uVar11 < uVar9);
  }
  pVVar2 = local_38;
  ub::VarType::VarType(local_38,local_88);
  std::vector<deqp::gls::ub::VarType,_std::allocator<deqp::gls::ub::VarType>_>::~vector(&local_58);
  return pVVar2;
}

Assistant:

VarType RandomUniformBlockCase::generateType (de::Random& rnd, int typeDepth, bool arrayOk)
{
	const float structWeight	= 0.1f;
	const float arrayWeight		= 0.1f;

	if (typeDepth < m_maxStructDepth && rnd.getFloat() < structWeight)
	{
		const float		unusedVtxWeight		= 0.15f;
		const float		unusedFragWeight	= 0.15f;
		bool			unusedOk			= (m_features & FEATURE_UNUSED_MEMBERS) != 0;
		vector<VarType>	memberTypes;
		int				numMembers = rnd.getInt(1, m_maxStructMembers);

		// Generate members first so nested struct declarations are in correct order.
		for (int ndx = 0; ndx < numMembers; ndx++)
			memberTypes.push_back(generateType(rnd, typeDepth+1, true));

		StructType& structType = m_interface.allocStruct((string("s") + genName('A', 'Z', m_structNdx)).c_str());
		m_structNdx += 1;

		DE_ASSERT(numMembers <= 'Z' - 'A');
		for (int ndx = 0; ndx < numMembers; ndx++)
		{
			deUint32 flags = 0;

			flags |= (unusedOk && rnd.getFloat() < unusedVtxWeight)		? UNUSED_VERTEX		: 0;
			flags |= (unusedOk && rnd.getFloat() < unusedFragWeight)	? UNUSED_FRAGMENT	: 0;

			structType.addMember((string("m") + (char)('A' + ndx)).c_str(), memberTypes[ndx], flags);
		}

		return VarType(&structType);
	}
	else if (m_maxArrayLength > 0 && arrayOk && rnd.getFloat() < arrayWeight)
	{
		const bool	arraysOfArraysOk	= (m_features & FEATURE_ARRAYS_OF_ARRAYS) != 0;
		const int	arrayLength			= rnd.getInt(1, m_maxArrayLength);
		VarType	elementType	= generateType(rnd, typeDepth, arraysOfArraysOk);
		return VarType(elementType, arrayLength);
	}
	else
	{
		vector<glu::DataType> typeCandidates;

		typeCandidates.push_back(glu::TYPE_FLOAT);
		typeCandidates.push_back(glu::TYPE_INT);
		typeCandidates.push_back(glu::TYPE_UINT);
		typeCandidates.push_back(glu::TYPE_BOOL);

		if (m_features & FEATURE_VECTORS)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC2);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC3);
			typeCandidates.push_back(glu::TYPE_FLOAT_VEC4);
			typeCandidates.push_back(glu::TYPE_INT_VEC2);
			typeCandidates.push_back(glu::TYPE_INT_VEC3);
			typeCandidates.push_back(glu::TYPE_INT_VEC4);
			typeCandidates.push_back(glu::TYPE_UINT_VEC2);
			typeCandidates.push_back(glu::TYPE_UINT_VEC3);
			typeCandidates.push_back(glu::TYPE_UINT_VEC4);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC2);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC3);
			typeCandidates.push_back(glu::TYPE_BOOL_VEC4);
		}

		if (m_features & FEATURE_MATRICES)
		{
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT2X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT3X4);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X2);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4X3);
			typeCandidates.push_back(glu::TYPE_FLOAT_MAT4);
		}

		glu::DataType	type	= rnd.choose<glu::DataType>(typeCandidates.begin(), typeCandidates.end());
		deUint32		flags	= 0;

		if (!glu::isDataTypeBoolOrBVec(type))
		{
			// Precision.
			static const deUint32 precisionCandidates[] = { PRECISION_LOW, PRECISION_MEDIUM, PRECISION_HIGH };
			flags |= rnd.choose<deUint32>(&precisionCandidates[0], &precisionCandidates[DE_LENGTH_OF_ARRAY(precisionCandidates)]);
		}

		return VarType(type, flags);
	}
}